

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O3

void __thiscall
TadsHttpReplyResult::TadsHttpReplyResult
          (TadsHttpReplyResult *this,TadsHttpRequest *req,vm_globalvar_t *reqvar,bodyArg *body,
          int sock_err,char *msg)

{
  char *pcVar1;
  
  TadsMessage::TadsMessage((TadsMessage *)this,"TadsEventMessage",(OS_Event *)0x0);
  (this->super_TadsEventMessage).super_TadsMessage.super_CVmRefCntObj._vptr_CVmRefCntObj =
       (_func_int **)&PTR__TadsHttpReplyResult_0034b640;
  this->vmg = (vm_globals *)0x0;
  this->req = req;
  this->reqvar = reqvar;
  this->body = body;
  this->sock_err = sock_err;
  pcVar1 = lib_copy_str(msg);
  this->msg = pcVar1;
  return;
}

Assistant:

TadsHttpReplyResult(VMG_ TadsHttpRequest *req, vm_globalvar_t *reqvar,
                        bodyArg *body, int sock_err, const char *msg)
        : TadsEventMessage(0)
    {
        /* save the VM globals for use in the main thread */
        this->vmg = VMGLOB_ADDR;

        /* remember our parameters */
        this->req = req;
        this->reqvar = reqvar;
        this->body = body;
        this->sock_err = sock_err;
        this->msg = lib_copy_str(msg);
    }